

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O2

PropResult __thiscall
Clasp::DomainHeuristic::propagate(DomainHeuristic *this,Solver *s,Literal param_2,uint32 *aId)

{
  uint16 *gPrio;
  uint32 dl;
  PropResult PVar1;
  pointer pFVar2;
  pointer pDVar3;
  ulong uVar4;
  uint32 actionId;
  Frame local_48;
  Constraint *local_40;
  FrameVec *local_38;
  
  actionId = *aId;
  dl = (s->levels_).super_type.ebo_.size;
  local_38 = &this->frames_;
  local_40 = &this->super_Constraint;
  pDVar3 = (this->actions_).ebo_.buf;
  do {
    uVar4 = *(ulong *)(pDVar3 + actionId);
    if ((*(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uint)((int)uVar4 * 4)) & 3) == 0) {
      gPrio = (this->prios_).ebo_.buf
              [(ulong)*(uint *)&(this->super_ClaspVsids_t<Clasp::DomScore>).score_.ebo_.buf
                                [uVar4 & 0x3fffffff].field_0xc & 0x3fffffff].prio +
              (uVar4 >> 0x1e & 3);
      if (*gPrio <= pDVar3[actionId].prio) {
        applyAction(this,s,pDVar3 + actionId,gPrio);
        pFVar2 = (this->frames_).ebo_.buf;
        uVar4 = (ulong)((this->frames_).ebo_.size - 1);
        if (dl != pFVar2[uVar4].dl) {
          Solver::addUndoWatch(s,dl,local_40);
          local_48.head = 0x7fffffff;
          local_48.dl = dl;
          bk_lib::
          pod_vector<Clasp::DomainHeuristic::Frame,_std::allocator<Clasp::DomainHeuristic::Frame>_>
          ::push_back(local_38,&local_48);
          pFVar2 = (this->frames_).ebo_.buf;
          uVar4 = (ulong)((this->frames_).ebo_.size - 1);
        }
        pushUndo(this,&pFVar2[uVar4].head,actionId);
        pDVar3 = (this->actions_).ebo_.buf;
        uVar4 = *(ulong *)(pDVar3 + actionId);
      }
    }
    actionId = actionId + 1;
  } while ((long)uVar4 < 0);
  PVar1.ok = true;
  PVar1.keepWatch = true;
  return PVar1;
}

Assistant:

Constraint::PropResult DomainHeuristic::propagate(Solver& s, Literal, uint32& aId) {
	uint32 n = aId;
	uint32 D = s.decisionLevel();
	do {
		DomAction& a = actions_[n];
		uint16& prio = this->prio(a.var, a.mod);
		if (s.value(a.var) == value_free && a.prio >= prio) {
			applyAction(s, a, prio);
			if (D != frames_.back().dl) {
				s.addUndoWatch(D, this);
				frames_.push_back(Frame(D, DomAction::UNDO_NIL));
			}
			pushUndo(frames_.back().head, n);
		}
	} while (actions_[n++].next);
	return PropResult(true, true);
}